

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mcu8str_create_from_cstr(mcu8str *__return_storage_ptr__,char *c_str)

{
  mcu8str_size_t prealloc_size;
  
  if (*c_str == '\0') {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
    prealloc_size = 0;
  }
  else {
    prealloc_size = mctools_strlen(c_str,0);
    mcu8str_create(__return_storage_ptr__,prealloc_size);
    memcpy(__return_storage_ptr__->c_str,c_str,prealloc_size + 1);
  }
  __return_storage_ptr__->size = (uint)prealloc_size;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcu8str_create_from_cstr( const char * c_str )
  {
    if ( ! *c_str )
      return mcu8str_create_empty();
    const mcu8str_size_t o_size = mctools_strlen( c_str, 0 );
    assert( o_size > 0 );
    mcu8str str = mcu8str_create( o_size );
    //str.c_str is newly allocated, so there can be no overlap:
    STDNS memcpy( str.c_str, c_str, o_size + 1 );
    str.size = (unsigned)o_size;//cast ok, mctools_strlen checked.
    return str;
  }